

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

PatternSyntax * __thiscall slang::parsing::Parser::parsePattern(Parser *this)

{
  Token star;
  Token variableName;
  Token closeParen;
  Token dot_00;
  Token dot_01;
  Token memberName;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeBrace_00;
  Token openParen_00;
  Token tagged_00;
  Token openBrace_00;
  bool bVar1;
  bool bVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  undefined8 *in_RDI;
  Token TVar3;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token closeBrace;
  Token openBrace;
  PatternSyntax *pattern_1;
  Token name;
  Token tagged;
  Token dot;
  PatternSyntax *pattern;
  Token openParen;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  uint32_t in_stack_fffffffffffffd34;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *this_01;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 uVar5;
  undefined2 in_stack_fffffffffffffd3c;
  TokenKind in_stack_fffffffffffffd3e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  ParserBase *in_stack_fffffffffffffd50;
  bitmask<slang::parsing::detail::ExpressionOptions> local_24c [2];
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffdc0;
  undefined4 local_1cc;
  RequireItems in_stack_fffffffffffffe44;
  SyntaxNode *in_stack_fffffffffffffe48;
  SyntaxNode *in_stack_fffffffffffffe50;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe58;
  ParserBase *in_stack_fffffffffffffe60;
  DiagCode in_stack_fffffffffffffe70;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe78;
  AllowEmpty in_stack_fffffffffffffe80;
  undefined1 in_stack_ffffffffffffffd0 [16];
  TokenKind TVar6;
  StructurePatternSyntax *local_8;
  Parser *this_00;
  
  kind = (TokenKind)((ulong)stack0xfffffffffffffdb8 >> 0x30);
  TVar3 = ParserBase::peek((ParserBase *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  this_00 = (Parser *)TVar3.info;
  TVar6 = TVar3.kind;
  if (TVar6 == ApostropheOpenBrace) {
    ParserBase::consume(in_stack_fffffffffffffd50);
    Token::Token((Token *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0xbf3b5b);
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd40._M_extent_value,
                             in_stack_fffffffffffffd3e);
    TVar3.info = (Info *)in_stack_fffffffffffffe50;
    TVar3._0_8_ = in_stack_fffffffffffffe48;
    bVar1 = false;
    if (bVar2) {
      TVar3 = ParserBase::peek((ParserBase *)
                               CONCAT26(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                )),in_stack_fffffffffffffd34);
      bVar1 = TVar3.kind == Colon;
    }
    if (bVar1) {
      this_01 = (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                &stack0xfffffffffffffe38;
      uVar4 = 0x4c0005;
      uVar5 = 0;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace,slang::parsing::Parser::parsePattern()::__0>
                (in_stack_fffffffffffffe60,
                 (SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                 in_stack_fffffffffffffe58._M_extent_value,TVar3.info._6_2_,TVar3.info._4_2_,
                 (Token *)TVar3._0_8_,0x4c0005,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe80);
      src = extraout_RDX;
    }
    else {
      local_1cc = 0x4c0005;
      this_01 = (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                &stack0xfffffffffffffe28;
      uVar4 = 0x4c0005;
      uVar5 = 0;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace,slang::parsing::Parser::parsePattern()::__1>
                (in_stack_fffffffffffffe60,
                 (SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                 in_stack_fffffffffffffe58._M_extent_value,TVar3.info._6_2_,TVar3.info._4_2_,
                 (Token *)TVar3._0_8_,in_stack_fffffffffffffe44,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffe80);
      src = extraout_RDX_00;
    }
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffe68,
               (EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._4_2_ = in_stack_fffffffffffffd3c;
    elements._M_ptr._0_4_ = uVar5;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffd3e;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffd40._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
    SeparatedSyntaxList(this_01,elements);
    openBrace_00.info = (Info *)in_stack_fffffffffffffd50;
    openBrace_00.kind = (short)in_stack_fffffffffffffd48;
    openBrace_00._2_1_ = (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
    openBrace_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
    openBrace_00.rawLen = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    closeBrace_00.rawLen._0_2_ = in_stack_fffffffffffffd3c;
    closeBrace_00.kind = (short)uVar5;
    closeBrace_00._2_1_ = (char)((uint)uVar5 >> 0x10);
    closeBrace_00.numFlags.raw = (char)((uint)uVar5 >> 0x18);
    closeBrace_00.rawLen._2_2_ = in_stack_fffffffffffffd3e;
    closeBrace_00.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
    local_8 = slang::syntax::SyntaxFactory::structurePattern
                        ((SyntaxFactory *)this_01,openBrace_00,
                         (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                         CONCAT44(in_stack_fffffffffffffd2c,uVar4),closeBrace_00);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0xbf3da7);
  }
  else if (TVar6 == OpenParenthesis) {
    ParserBase::consume(in_stack_fffffffffffffd50);
    parsePattern(this_00);
    ParserBase::expect(in_stack_fffffffffffffdc0,kind);
    openParen_00.info = (Info *)in_stack_fffffffffffffd50;
    openParen_00.kind = (short)in_stack_fffffffffffffd48;
    openParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
    openParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
    openParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    closeParen.rawLen._0_2_ = in_stack_fffffffffffffd3c;
    closeParen.kind = (short)in_stack_fffffffffffffd38;
    closeParen._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
    closeParen.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
    closeParen.rawLen._2_2_ = in_stack_fffffffffffffd3e;
    closeParen.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
    local_8 = (StructurePatternSyntax *)
              slang::syntax::SyntaxFactory::parenthesizedPattern
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),openParen_00,
                         (PatternSyntax *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),closeParen);
  }
  else if (TVar6 == Dot) {
    ParserBase::consume(in_stack_fffffffffffffd50);
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd40._M_extent_value,
                             in_stack_fffffffffffffd3e);
    if (bVar1) {
      ParserBase::consume(in_stack_fffffffffffffd50);
      dot_00.rawLen._0_2_ = in_stack_fffffffffffffd3c;
      dot_00.kind = (short)in_stack_fffffffffffffd38;
      dot_00._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
      dot_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
      dot_00.rawLen._2_2_ = in_stack_fffffffffffffd3e;
      dot_00.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
      star.rawLen = in_stack_fffffffffffffd2c;
      star.kind = (short)in_stack_fffffffffffffd28;
      star._2_1_ = (char)((uint)in_stack_fffffffffffffd28 >> 0x10);
      star.numFlags.raw = (char)((uint)in_stack_fffffffffffffd28 >> 0x18);
      star.info._0_4_ = in_stack_fffffffffffffd30;
      star.info._4_4_ = in_stack_fffffffffffffd34;
      local_8 = (StructurePatternSyntax *)
                slang::syntax::SyntaxFactory::wildcardPattern((SyntaxFactory *)0xbf3977,dot_00,star)
      ;
    }
    else {
      ParserBase::expect(in_stack_fffffffffffffdc0,kind);
      dot_01.rawLen._0_2_ = in_stack_fffffffffffffd3c;
      dot_01.kind = (short)in_stack_fffffffffffffd38;
      dot_01._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
      dot_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
      dot_01.rawLen._2_2_ = in_stack_fffffffffffffd3e;
      dot_01.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
      variableName.rawLen = in_stack_fffffffffffffd2c;
      variableName.kind = (short)in_stack_fffffffffffffd28;
      variableName._2_1_ = (char)((uint)in_stack_fffffffffffffd28 >> 0x10);
      variableName.numFlags.raw = (char)((uint)in_stack_fffffffffffffd28 >> 0x18);
      variableName.info._0_4_ = in_stack_fffffffffffffd30;
      variableName.info._4_4_ = in_stack_fffffffffffffd34;
      local_8 = (StructurePatternSyntax *)
                slang::syntax::SyntaxFactory::variablePattern
                          ((SyntaxFactory *)0xbf39fe,dot_01,variableName);
    }
  }
  else if (TVar6 == TaggedKeyword) {
    ParserBase::consume(in_stack_fffffffffffffd50);
    ParserBase::expect(in_stack_fffffffffffffdc0,kind);
    ParserBase::peek((ParserBase *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    bVar1 = slang::syntax::SyntaxFacts::isPossiblePattern(Unknown);
    if (bVar1) {
      parsePattern(this_00);
    }
    tagged_00.info = (Info *)in_stack_fffffffffffffd50;
    tagged_00.kind = (short)in_stack_fffffffffffffd48;
    tagged_00._2_1_ = (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
    tagged_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
    tagged_00.rawLen = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    memberName.rawLen._0_2_ = in_stack_fffffffffffffd3c;
    memberName.kind = (short)in_stack_fffffffffffffd38;
    memberName._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
    memberName.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
    memberName.rawLen._2_2_ = in_stack_fffffffffffffd3e;
    memberName.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
    local_8 = (StructurePatternSyntax *)
              slang::syntax::SyntaxFactory::taggedPattern
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),tagged_00,
                         memberName,
                         (PatternSyntax *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  }
  else {
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(local_24c,PatternContext);
    parseSubExpression(TVar3._0_8_,
                       (bitmask<slang::parsing::detail::ExpressionOptions>)TVar3.info._4_4_,
                       in_stack_ffffffffffffffd0._12_4_);
    local_8 = (StructurePatternSyntax *)
              slang::syntax::SyntaxFactory::expressionPattern
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         (ExpressionSyntax *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  }
  return &local_8->super_PatternSyntax;
}

Assistant:

PatternSyntax& Parser::parsePattern() {
    switch (peek().kind) {
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& pattern = parsePattern();
            return factory.parenthesizedPattern(openParen, pattern,
                                                expect(TokenKind::CloseParenthesis));
        }
        case TokenKind::Dot: {
            auto dot = consume();
            if (peek(TokenKind::Star))
                return factory.wildcardPattern(dot, consume());
            return factory.variablePattern(dot, expect(TokenKind::Identifier));
        }
        case TokenKind::TaggedKeyword: {
            auto tagged = consume();
            auto name = expect(TokenKind::Identifier);

            PatternSyntax* pattern = nullptr;
            if (isPossiblePattern(peek().kind))
                pattern = &parsePattern();

            return factory.taggedPattern(tagged, name, pattern);
        }
        case TokenKind::ApostropheOpenBrace: {
            auto openBrace = consume();
            Token closeBrace;
            SmallVector<TokenOrSyntax, 4> buffer;

            if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Colon) {
                parseList<isIdentifierOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() { return &parseMemberPattern(); });
            }
            else {
                parseList<isPossiblePatternOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() {
                        auto& pattern = parsePattern();
                        return &factory.orderedStructurePatternMember(pattern);
                    });
            }

            return factory.structurePattern(openBrace, buffer.copy(alloc), closeBrace);
        }
        default:
            break;
    }

    // otherwise, it's either an expression or an error (parseExpression will handle that for us)
    return factory.expressionPattern(parseSubExpression(ExpressionOptions::PatternContext, 0));
}